

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

int getPrec(OPCODE opcode)

{
  undefined4 local_c;
  OPCODE opcode_local;
  
  if (opcode == OP_Equal) {
    local_c = 5;
  }
  else if ((opcode == OP_Open_parenthesis) || (opcode == OP_Closed_parenthesis)) {
    local_c = 4;
  }
  else if ((opcode == OP_Plus) || (opcode == OP_Minus)) {
    local_c = 3;
  }
  else if ((opcode == OP_Multi) || (opcode == OP_Div)) {
    local_c = 2;
  }
  else if (opcode == OP_Pow) {
    local_c = 1;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

int getPrec(enum OPCODE opcode)
{
    if (opcode == OP_Equal) {
        return 5;
    }

    if (opcode == OP_Open_parenthesis ||
        opcode == OP_Closed_parenthesis) {
        return 4;
    }

    if (opcode == OP_Plus ||
        opcode == OP_Minus) {
        return 3;
    }

    if (opcode == OP_Multi ||
        opcode == OP_Div) {
        return 2;
    }

    if (opcode == OP_Pow) {
        return 1;
    }

    return 0;
}